

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
trial::dynamic::convert::
into<std::vector<double,std::allocator<double>>,trial::dynamic::basic_variable<std::allocator<char>>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,convert *this,
          basic_variable<std::allocator<char>_> *u)

{
  system_error *this_00;
  error_code __ec;
  error_code error;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  overloader<std::vector<double,_std::allocator<double>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
  ::into(__return_storage_ptr__,(basic_variable<std::allocator<char>_> *)this,&local_28);
  if (local_28._M_value == 0) {
    return __return_storage_ptr__;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = local_28._M_value;
  __ec._M_cat = local_28._M_cat;
  std::system_error::system_error(this_00,__ec);
  *(undefined ***)this_00 = &PTR__system_error_00128850;
  __cxa_throw(this_00,&dynamic::error::typeinfo,std::system_error::~system_error);
}

Assistant:

T into(const U& u)
{
    std::error_code error;
    auto result = into<T>(u, error);
    if (error)
        throw dynamic::error(error);
    return result;
}